

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_graph_compute(ggml_context *ctx,ggml_cgraph *cgraph)

{
  pthread_t __th;
  undefined8 *puVar1;
  ggml_lock_t gVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ggml_tensor *pgVar7;
  undefined1 *puVar8;
  int *piVar9;
  pthread_t *__newthread;
  undefined1 auStack_2f8 [8];
  void *local_2f0;
  void **local_2e8;
  size_t local_2e0;
  undefined8 *local_2d8;
  size_t *local_2d0;
  void *local_2c8;
  void **local_2c0;
  size_t local_2b8;
  undefined8 *local_2b0;
  size_t *local_2a8;
  void *local_2a0;
  size_t *local_298;
  size_t local_290;
  int *local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  ulong local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  ulong local_238;
  void *local_230;
  undefined8 *local_228;
  size_t local_220;
  undefined1 *local_218;
  undefined4 *local_210;
  size_t *local_208;
  undefined1 *local_200;
  int64_t perf_time_us_cur_1;
  int64_t perf_cycles_cur_1;
  int local_1e0;
  int rc_1;
  int j_3;
  int64_t perf_time_us_cur;
  int64_t perf_cycles_cur;
  undefined4 local_1c0;
  byte local_1ba;
  undefined1 local_1b9;
  ggml_lock_t local_1b8;
  undefined4 local_1b4;
  undefined1 local_1ad;
  int local_1ac;
  ggml_lock_t local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  int iStack_19c;
  int local_198;
  undefined4 uStack_194;
  size_t local_190;
  void *local_188;
  int local_180;
  byte local_17a;
  undefined1 local_179;
  int j_2;
  undefined4 local_174;
  ggml_lock_t local_170;
  int local_16c;
  undefined4 local_168;
  byte local_162;
  undefined1 local_161;
  ggml_lock_t local_160;
  undefined4 local_15c;
  undefined1 local_155;
  int local_154;
  ggml_lock_t local_150;
  undefined4 local_14c;
  undefined4 local_148;
  int iStack_144;
  int local_140;
  undefined4 uStack_13c;
  size_t local_138;
  void *local_130;
  int local_128;
  byte local_122;
  undefined1 local_121;
  int j_1;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  ggml_compute_params params;
  int64_t perf_node_start_time_us;
  int64_t perf_node_start_cycles;
  ggml_tensor *node_1;
  int i_1;
  int64_t perf_start_time_us;
  int64_t perf_start_cycles;
  size_t cur_3;
  ulong uStack_b8;
  int ne11;
  size_t cur_2;
  ulong uStack_a8;
  int nk;
  size_t cur_1;
  size_t cur;
  ggml_tensor *node;
  ulong uStack_88;
  int i;
  size_t work_size;
  undefined8 uStack_78;
  int rc;
  undefined4 local_70;
  int local_6c;
  atomic_int local_68;
  size_t local_60 [2];
  undefined8 local_50;
  long local_48;
  int local_40;
  undefined1 local_39;
  int j;
  ggml_compute_state *workers;
  int local_28;
  ggml_compute_state_shared state_shared;
  int n_threads;
  ggml_cgraph *cgraph_local;
  ggml_context *ctx_local;
  
  piVar9 = (int *)auStack_2f8;
  stack0xffffffffffffffe8 = cgraph;
  if (cgraph->n_threads < 1) {
    cgraph->n_threads = 8;
  }
  state_shared.n_ready = cgraph->n_threads;
  workers._4_4_ = 0;
  local_28 = state_shared.n_ready;
  state_shared.spin = 0;
  state_shared.n_threads._0_1_ = 0;
  state_shared.n_threads._1_1_ = 0;
  if (state_shared.n_ready < 2) {
    local_200 = (undefined1 *)0x0;
  }
  else {
    piVar9 = (int *)(auStack_2f8 +
                    -((long)(state_shared.n_ready + -1) * 0x38 + 0xfU & 0xfffffffffffffff0));
    local_200 = (undefined1 *)piVar9;
  }
  _j = local_200;
  if (1 < state_shared.n_ready) {
    local_39 = 1;
    LOCK();
    state_shared.n_threads._0_1_ = 1;
    UNLOCK();
    for (local_40 = 0; local_40 < state_shared.n_ready + -1; local_40 = local_40 + 1) {
      local_218 = _j + (long)local_40 * 0x38;
      uStack_78 = 0;
      local_210 = &local_70;
      local_70 = 1;
      local_6c = local_40 + 1;
      local_68 = state_shared.n_ready;
      local_208 = local_60;
      if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
        local_220 = 0;
      }
      else {
        piVar9[-2] = 0x158831;
        piVar9[-1] = 0;
        local_220 = ggml_nbytes(*(ggml_tensor **)(piVar9 + -2));
      }
      puVar8 = local_218;
      *local_208 = local_220;
      local_228 = (undefined8 *)(local_210 + 6);
      if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
        local_230 = (void *)0x0;
      }
      else {
        local_230 = stack0xffffffffffffffe8->work->data;
      }
      *local_228 = local_230;
      local_50 = 0;
      local_48 = (long)&workers + 4;
      piVar9[-2] = 0x1588cc;
      piVar9[-1] = 0;
      memcpy(puVar8,&stack0xffffffffffffff88,0x38);
      __newthread = (pthread_t *)(_j + (long)local_40 * 0x38);
      puVar8 = _j + (long)local_40 * 0x38;
      piVar9[-2] = 0x1588fa;
      piVar9[-1] = 0;
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,ggml_graph_compute_thread,puVar8);
      if (iVar3 != 0) {
        piVar9[-2] = 0x15892e;
        piVar9[-1] = 0;
        fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                0x2436,"rc == 0");
        piVar9[-2] = 0x158933;
        piVar9[-1] = 0;
        abort();
      }
    }
  }
  uStack_88 = 0;
  node._4_4_ = 0;
  do {
    if (stack0xffffffffffffffe8->n_nodes <= node._4_4_) {
      if ((stack0xffffffffffffffe8->work != (ggml_tensor *)0x0) &&
         (stack0xffffffffffffffe8->work_size < uStack_88)) {
        piVar9[-2] = 0x15922c;
        piVar9[-1] = 0;
        fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                0x2513,"false");
        piVar9[-2] = 0x159231;
        piVar9[-1] = 0;
        abort();
      }
      if ((uStack_88 != 0) && (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0)) {
        stack0xffffffffffffffe8->work_size = uStack_88 + (long)((state_shared.n_ready + -1) * 0x40);
        piVar9[-2] = 0x159275;
        piVar9[-1] = 0;
        pgVar7 = ggml_new_tensor_1d(*(ggml_context **)(piVar9 + 2),piVar9[1],*piVar9);
        stack0xffffffffffffffe8->work = pgVar7;
      }
      for (node_1._4_4_ = 0; node_1._4_4_ < stack0xffffffffffffffe8->n_nodes;
          node_1._4_4_ = node_1._4_4_ + 1) {
        pgVar7 = stack0xffffffffffffffe8->nodes[node_1._4_4_];
        params.wdata = (void *)0x0;
        local_118 = 0;
        local_114 = 0;
        params.type = pgVar7->n_tasks;
        local_288 = &params.nth;
        if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
          local_290 = 0;
        }
        else {
          piVar9[-2] = 0x15932d;
          piVar9[-1] = 0;
          local_290 = ggml_nbytes(*(ggml_tensor **)(piVar9 + -2));
        }
        *(size_t *)local_288 = local_290;
        local_298 = &params.wsize;
        if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
          local_2a0 = (void *)0x0;
        }
        else {
          local_2a0 = stack0xffffffffffffffe8->work->data;
        }
        params.wsize = (size_t)local_2a0;
        piVar9[-2] = 0x1593b6;
        piVar9[-1] = 0;
        ggml_compute_forward(*(ggml_compute_params **)(piVar9 + 6),*(ggml_tensor **)(piVar9 + 4));
        gVar2 = state_shared.spin;
        if (1 < pgVar7->n_tasks) {
          local_11c = 1;
          LOCK();
          state_shared.spin = state_shared.spin + 1;
          UNLOCK();
          j_1 = gVar2;
          if (gVar2 == state_shared.n_ready + -1) {
            local_121 = 0;
            LOCK();
            state_shared.n_threads._0_1_ = 0;
            UNLOCK();
          }
          do {
            local_122 = (byte)state_shared.n_threads;
          } while (((byte)state_shared.n_threads & 1) != 0);
          for (local_128 = 0; gVar2 = state_shared.spin, local_128 < state_shared.n_ready + -1;
              local_128 = local_128 + 1) {
            local_2b0 = (undefined8 *)(_j + (long)local_128 * 0x38 + 8);
            local_148 = 1;
            iStack_144 = local_128 + 1;
            local_140 = pgVar7->n_tasks;
            local_2a8 = &local_138;
            if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
              local_2b8 = 0;
            }
            else {
              piVar9[-2] = 0x1594a6;
              piVar9[-1] = 0;
              local_2b8 = ggml_nbytes(*(ggml_tensor **)(piVar9 + -2));
            }
            puVar1 = local_2b0;
            *local_2a8 = local_2b8;
            local_2c0 = &local_130;
            if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
              local_2c8 = (void *)0x0;
            }
            else {
              local_2c8 = stack0xffffffffffffffe8->work->data;
            }
            local_130 = local_2c8;
            *local_2b0 = CONCAT44(iStack_144,local_148);
            puVar1[1] = CONCAT44(uStack_13c,local_140);
            puVar1[2] = local_138;
            puVar1[3] = local_130;
            *(ggml_tensor **)(_j + (long)local_128 * 0x38 + 0x28) = pgVar7;
          }
          local_14c = 1;
          LOCK();
          state_shared.spin = state_shared.spin + -1;
          UNLOCK();
          local_150 = gVar2;
          do {
            local_154 = state_shared.spin;
          } while (0 < state_shared.spin);
          local_155 = 1;
          LOCK();
          state_shared.n_threads._0_1_ = 1;
          UNLOCK();
        }
        local_118 = 1;
        piVar9[-2] = 0x1595dd;
        piVar9[-1] = 0;
        ggml_compute_forward(*(ggml_compute_params **)(piVar9 + 6),*(ggml_tensor **)(piVar9 + 4));
        if (1 < pgVar7->n_tasks) {
          local_15c = 1;
          LOCK();
          UNLOCK();
          local_160 = state_shared.spin;
          if (state_shared.spin == state_shared.n_ready + -1) {
            local_161 = 0;
            LOCK();
            state_shared.n_threads._0_1_ = 0;
            UNLOCK();
          }
          do {
            local_162 = (byte)state_shared.n_threads;
          } while (((byte)state_shared.n_threads & 1) != 0);
          local_168 = 1;
          LOCK();
          UNLOCK();
          local_16c = state_shared.spin + 1;
          do {
            local_170 = state_shared.spin;
          } while (state_shared.spin != 0);
        }
        gVar2 = state_shared.spin;
        if (1 < pgVar7->n_tasks) {
          local_174 = 1;
          LOCK();
          state_shared.spin = state_shared.spin + 1;
          UNLOCK();
          j_2 = gVar2;
          if (gVar2 == state_shared.n_ready + -1) {
            local_179 = 0;
            LOCK();
            state_shared.n_threads._0_1_ = 0;
            UNLOCK();
          }
          do {
            local_17a = (byte)state_shared.n_threads;
          } while (((byte)state_shared.n_threads & 1) != 0);
          for (local_180 = 0; gVar2 = state_shared.spin, local_180 < state_shared.n_ready + -1;
              local_180 = local_180 + 1) {
            local_2d8 = (undefined8 *)(_j + (long)local_180 * 0x38 + 8);
            local_1a0 = 2;
            iStack_19c = local_180 + 1;
            local_198 = pgVar7->n_tasks;
            local_2d0 = &local_190;
            if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
              local_2e0 = 0;
            }
            else {
              piVar9[-2] = 0x159762;
              piVar9[-1] = 0;
              local_2e0 = ggml_nbytes(*(ggml_tensor **)(piVar9 + -2));
            }
            puVar1 = local_2d8;
            *local_2d0 = local_2e0;
            local_2e8 = &local_188;
            if (stack0xffffffffffffffe8->work == (ggml_tensor *)0x0) {
              local_2f0 = (void *)0x0;
            }
            else {
              local_2f0 = stack0xffffffffffffffe8->work->data;
            }
            local_188 = local_2f0;
            *local_2d8 = CONCAT44(iStack_19c,local_1a0);
            puVar1[1] = CONCAT44(uStack_194,local_198);
            puVar1[2] = local_190;
            puVar1[3] = local_188;
            *(ggml_tensor **)(_j + (long)local_180 * 0x38 + 0x28) = pgVar7;
          }
          local_1a4 = 1;
          LOCK();
          state_shared.spin = state_shared.spin + -1;
          UNLOCK();
          local_1a8 = gVar2;
          do {
            local_1ac = state_shared.spin;
          } while (0 < state_shared.spin);
          local_1ad = 1;
          LOCK();
          state_shared.n_threads._0_1_ = 1;
          UNLOCK();
        }
        local_118 = 2;
        piVar9[-2] = 0x159899;
        piVar9[-1] = 0;
        ggml_compute_forward(*(ggml_compute_params **)(piVar9 + 6),*(ggml_tensor **)(piVar9 + 4));
        if (1 < pgVar7->n_tasks) {
          local_1b4 = 1;
          LOCK();
          UNLOCK();
          local_1b8 = state_shared.spin;
          if (state_shared.spin == state_shared.n_ready + -1) {
            local_1b9 = 0;
            LOCK();
            state_shared.n_threads._0_1_ = 0;
            UNLOCK();
          }
          do {
            local_1ba = (byte)state_shared.n_threads;
          } while (((byte)state_shared.n_threads & 1) != 0);
          local_1c0 = 1;
          LOCK();
          UNLOCK();
          perf_cycles_cur._4_4_ = state_shared.spin + 1;
          do {
            perf_cycles_cur._0_4_ = state_shared.spin;
          } while (state_shared.spin != 0);
        }
        perf_time_us_cur = 0;
        _j_3 = 0;
        pgVar7->perf_runs = pgVar7->perf_runs + 1;
        pgVar7->perf_cycles = pgVar7->perf_cycles;
        pgVar7->perf_time_us = pgVar7->perf_time_us;
      }
      if (1 < state_shared.n_ready) {
        rc_1._3_1_ = 1;
        LOCK();
        state_shared.n_threads._1_1_ = 1;
        UNLOCK();
        rc_1._2_1_ = 1;
        LOCK();
        state_shared.n_threads._0_1_ = 1;
        UNLOCK();
        for (local_1e0 = 0; local_1e0 < state_shared.n_ready + -1; local_1e0 = local_1e0 + 1) {
          __th = *(pthread_t *)(_j + (long)local_1e0 * 0x38);
          piVar9[-2] = 0x159a02;
          piVar9[-1] = 0;
          perf_cycles_cur_1._4_4_ = pthread_join(__th,(void **)0x0);
          if (perf_cycles_cur_1._4_4_ != 0) {
            piVar9[-2] = 0x159a3c;
            piVar9[-1] = 0;
            fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c"
                    ,0x25b9,"rc == 0");
            piVar9[-2] = 0x159a41;
            piVar9[-1] = 0;
            abort();
          }
          perf_cycles_cur_1._4_4_ = 0;
        }
      }
      stack0xffffffffffffffe8->perf_runs = stack0xffffffffffffffe8->perf_runs + 1;
      stack0xffffffffffffffe8->perf_cycles = stack0xffffffffffffffe8->perf_cycles;
      stack0xffffffffffffffe8->perf_time_us = stack0xffffffffffffffe8->perf_time_us;
      return;
    }
    pgVar7 = stack0xffffffffffffffe8->nodes[node._4_4_];
    local_238 = (ulong)pgVar7->op;
    switch((ulong)pgVar7->op) {
    case 0:
      pgVar7->n_tasks = 1;
      break;
    case 1:
      pgVar7->n_tasks = 1;
      break;
    case 2:
      pgVar7->n_tasks = state_shared.n_ready;
      break;
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      pgVar7->n_tasks = 1;
      break;
    case 0x10:
      pgVar7->n_tasks = state_shared.n_ready;
      break;
    case 0x11:
      pgVar7->n_tasks = state_shared.n_ready;
      break;
    case 0x12:
    case 0x13:
      pgVar7->n_tasks = state_shared.n_ready;
      break;
    case 0x14:
      pgVar7->n_tasks = state_shared.n_ready;
      if (pgVar7->src0->nb[1] < pgVar7->src0->nb[0]) {
        piVar9[-2] = 0x158a64;
        piVar9[-1] = 0;
        sVar5 = ggml_nbytes(*(ggml_tensor **)(piVar9 + -2));
        cur_1 = sVar5 * (long)pgVar7->n_tasks;
      }
      else if ((pgVar7->src0->type == GGML_TYPE_F16) && (pgVar7->src1->type == GGML_TYPE_F32)) {
        local_240 = 2;
        pgVar7 = pgVar7->src1;
        piVar9[-2] = 0x158abd;
        piVar9[-1] = 0;
        iVar3 = ggml_nelements(pgVar7);
        cur_1 = local_240 * (long)iVar3;
      }
      else if ((pgVar7->src0->type == GGML_TYPE_F32) && (pgVar7->src1->type == GGML_TYPE_F32)) {
        cur_1 = 0;
      }
      else {
        if ((pgVar7->src0->type == GGML_TYPE_Q4_0) && (pgVar7->src1->type == GGML_TYPE_F32)) {
          local_248 = 0x14;
          pgVar7 = pgVar7->src1;
          piVar9[-2] = 0x158b47;
          piVar9[-1] = 0;
          iVar3 = ggml_nelements(pgVar7);
          uVar6 = local_248 * (long)iVar3;
        }
        else {
          if ((pgVar7->src0->type != GGML_TYPE_Q4_1) || (pgVar7->src1->type != GGML_TYPE_F32)) {
            piVar9[-2] = 0x158bff;
            piVar9[-1] = 0;
            fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c"
                    ,0x24a7,"false");
            piVar9[-2] = 0x158c04;
            piVar9[-1] = 0;
            abort();
          }
          local_250 = 0x18;
          pgVar7 = pgVar7->src1;
          piVar9[-2] = 0x158bad;
          piVar9[-1] = 0;
          iVar3 = ggml_nelements(pgVar7);
          uVar6 = local_250 * (long)iVar3;
        }
        cur_1 = uVar6 / 0x20;
      }
      if (cur_1 < uStack_88) {
        local_258 = uStack_88;
      }
      else {
        local_258 = cur_1;
      }
      uStack_88 = local_258;
      break;
    case 0x15:
      pgVar7->n_tasks = state_shared.n_ready;
      break;
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
      pgVar7->n_tasks = 1;
      break;
    case 0x1d:
      pgVar7->n_tasks = state_shared.n_ready;
      break;
    case 0x1e:
      pgVar7->n_tasks = 1;
      break;
    case 0x1f:
    case 0x20:
      pgVar7->n_tasks = state_shared.n_ready;
      if (pgVar7->src0->ne[3] != 1) {
        piVar9[-2] = 0x158cd7;
        piVar9[-1] = 0;
        fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                0x24c8,"node->src0->ne[3] == 1");
        piVar9[-2] = 0x158cdc;
        piVar9[-1] = 0;
        abort();
      }
      if (pgVar7->src1->ne[2] != 1) {
        piVar9[-2] = 0x158d1c;
        piVar9[-1] = 0;
        fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                0x24c9,"node->src1->ne[2] == 1");
        piVar9[-2] = 0x158d21;
        piVar9[-1] = 0;
        abort();
      }
      if (pgVar7->src1->ne[3] != 1) {
        piVar9[-2] = 0x158d61;
        piVar9[-1] = 0;
        fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                0x24ca,"node->src1->ne[3] == 1");
        piVar9[-2] = 0x158d66;
        piVar9[-1] = 0;
        abort();
      }
      iVar3 = pgVar7->src0->ne[0];
      if ((pgVar7->src0->type == GGML_TYPE_F16) && (pgVar7->src1->type == GGML_TYPE_F32)) {
        iVar4 = pgVar7->src0->ne[1];
        local_260 = iVar3;
        piVar9[-2] = 0x158dce;
        piVar9[-1] = 0;
        iVar4 = ggml_up32(iVar4);
        local_25c = local_260 * iVar4 * pgVar7->src0->ne[2];
        uStack_a8 = (long)(local_25c + ((iVar3 / 2) * 2 + pgVar7->src1->ne[0]) * pgVar7->src1->ne[1]
                          ) << 1;
      }
      else {
        if ((pgVar7->src0->type != GGML_TYPE_F32) || (pgVar7->src1->type != GGML_TYPE_F32)) {
          piVar9[-2] = 0x158f10;
          piVar9[-1] = 0;
          fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
                  0x24dc,"false");
          piVar9[-2] = 0x158f15;
          piVar9[-1] = 0;
          abort();
        }
        iVar4 = pgVar7->src0->ne[1];
        local_268 = iVar3;
        piVar9[-2] = 0x158e7d;
        piVar9[-1] = 0;
        iVar4 = ggml_up32(iVar4);
        local_264 = local_268 * iVar4 * pgVar7->src0->ne[2];
        uStack_a8 = (long)(local_264 + ((iVar3 / 2) * 2 + pgVar7->src1->ne[0]) * pgVar7->src1->ne[1]
                          ) << 2;
      }
      if (uStack_a8 < uStack_88) {
        local_270 = uStack_88;
      }
      else {
        local_270 = uStack_a8;
      }
      uStack_88 = local_270;
      break;
    case 0x21:
      pgVar7->n_tasks = state_shared.n_ready;
      uStack_b8 = 0;
      piVar9[-2] = 0x158f7f;
      piVar9[-1] = 0;
      iVar3 = ggml_up(piVar9[-1],piVar9[-2]);
      if (pgVar7->src1->type == GGML_TYPE_F32) {
        uStack_b8 = (long)iVar3 * 4 * (long)pgVar7->n_tasks +
                    (long)iVar3 * 4 * (long)pgVar7->n_tasks;
      }
      if (pgVar7->src1->type == GGML_TYPE_F16) {
        uStack_b8 = (long)iVar3 * 4 * (long)pgVar7->n_tasks +
                    (long)iVar3 * 4 * (long)pgVar7->n_tasks;
      }
      if (uStack_b8 < uStack_88) {
        local_278 = uStack_88;
      }
      else {
        local_278 = uStack_b8;
      }
      uStack_88 = local_278;
      break;
    case 0x22:
      pgVar7->n_tasks = state_shared.n_ready;
      perf_start_cycles = 0;
      if (pgVar7->src1->type == GGML_TYPE_F32) {
        perf_start_cycles =
             (long)pgVar7->src1->ne[1] * 4 * (long)pgVar7->n_tasks +
             (long)pgVar7->src1->ne[1] * 4 * (long)pgVar7->n_tasks;
      }
      if (pgVar7->src1->type == GGML_TYPE_F16) {
        perf_start_cycles =
             (long)pgVar7->src1->ne[1] * 4 * (long)pgVar7->n_tasks +
             (long)pgVar7->src1->ne[1] * 4 * (long)pgVar7->n_tasks;
      }
      if ((ulong)perf_start_cycles < uStack_88) {
        local_280 = uStack_88;
      }
      else {
        local_280 = perf_start_cycles;
      }
      uStack_88 = local_280;
      break;
    case 0x23:
      piVar9[-2] = 0x1591cb;
      piVar9[-1] = 0;
      fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",
              0x250d,"false");
      piVar9[-2] = 0x1591d0;
      piVar9[-1] = 0;
      abort();
    }
    node._4_4_ = node._4_4_ + 1;
  } while( true );
}

Assistant:

void ggml_graph_compute(struct ggml_context * ctx, struct ggml_cgraph * cgraph) {
    if (cgraph->n_threads <= 0) {
        cgraph->n_threads = 8;
    }

    const int n_threads = cgraph->n_threads;

    struct ggml_compute_state_shared state_shared = {
        /*.spin      =*/ GGML_LOCK_INITIALIZER,
        /*.n_threads =*/ n_threads,
        /*.n_ready   =*/ 0,
        /*.has_work  =*/ false,
        /*.stop      =*/ false,
    };
    struct ggml_compute_state * workers = n_threads > 1 ? alloca(sizeof(struct ggml_compute_state)*(n_threads - 1)) : NULL;

    // create thread pool
    if (n_threads > 1) {
        ggml_lock_init(&state_shared.spin);

        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            workers[j] = (struct ggml_compute_state) {
                .thrd   = 0,
                .params = {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = n_threads,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                },
                .node   = NULL,
                .shared = &state_shared,
            };

            int rc = ggml_thread_create(&workers[j].thrd, NULL, ggml_graph_compute_thread, &workers[j]);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }
    }

    // initialize tasks + work buffer
    {
        size_t work_size = 0;

        // thread scheduling for the different operations
        for (int i = 0; i < cgraph->n_nodes; i++) {
            struct ggml_tensor * node = cgraph->nodes[i];

            switch (node->op) {
                case GGML_OP_DUP:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_ADD:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SUB:
                case GGML_OP_MUL:
                case GGML_OP_DIV:
                case GGML_OP_SQR:
                case GGML_OP_SQRT:
                case GGML_OP_SUM:
                case GGML_OP_MEAN:
                case GGML_OP_REPEAT:
                case GGML_OP_ABS:
                case GGML_OP_SGN:
                case GGML_OP_NEG:
                case GGML_OP_STEP:
                case GGML_OP_RELU:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_GELU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SILU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_NORM:
                case GGML_OP_RMS_NORM:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_MUL_MAT:
                    {
                        node->n_tasks = n_threads;

                        // TODO: use different scheduling for different matrix sizes
                        //const int nr0 = ggml_nrows(node->src0);
                        //const int nr1 = ggml_nrows(node->src1);

                        //node->n_tasks = MIN(n_threads, MAX(1, nr0/128));
                        //printf("nr0 = %8d, nr1 = %8d, nr0*nr1 = %8d, n_tasks = %d\n", nr0, nr1, nr0*nr1, node->n_tasks);

                        size_t cur = 0;

                        // TODO: better way to determine if the matrix is transposed
                        if (node->src0->nb[1] < node->src0->nb[0]) {
                            cur = ggml_nbytes(node)*node->n_tasks; // TODO: this can become (n_tasks-1)
                                                                   // TODO: overestimated by factor of x2 for FP16
                        } else {
                            if (node->src0->type == GGML_TYPE_F16 &&
                                node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1; // TODO: this actually is doing nothing
                                                       //       the threads are still spinning
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src0: ne0 = %d, ne1 = %d, ne = %d\n", node->src0->ne[0], node->src0->ne[1], node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src1: ne0 = %d, ne1 = %d, ne = %d\n", node->src1->ne[0], node->src1->ne[1], node->src1->ne[0]*node->src1->ne[1]);
                                    //printf("cur = %zu\n", cur);
                                } else {
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
                                }
#else
                                cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
#endif
                            } else if (node->src0->type == GGML_TYPE_F32 &&
                                       node->src1->type == GGML_TYPE_F32) {
                                cur = 0;
                            } else if (node->src0->type == GGML_TYPE_Q4_0 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
#endif
                            } else if (node->src0->type == GGML_TYPE_Q4_1 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
#endif
                            } else {
                                GGML_ASSERT(false);
                            }
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_SCALE:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_CPY:
                case GGML_OP_RESHAPE:
                case GGML_OP_VIEW:
                case GGML_OP_PERMUTE:
                case GGML_OP_TRANSPOSE:
                case GGML_OP_GET_ROWS:
                case GGML_OP_DIAG_MASK_INF:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_SOFT_MAX:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_ROPE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_CONV_1D_1S:
                case GGML_OP_CONV_1D_2S:
                    {
                        node->n_tasks = n_threads;

                        GGML_ASSERT(node->src0->ne[3] == 1);
                        GGML_ASSERT(node->src1->ne[2] == 1);
                        GGML_ASSERT(node->src1->ne[3] == 1);

                        size_t cur = 0;
                        const int nk = node->src0->ne[0];

                        if (node->src0->type == GGML_TYPE_F16 &&
                            node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(ggml_fp16_t)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else if (node->src0->type == GGML_TYPE_F32 &&
                                   node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(float)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else {
                            GGML_ASSERT(false);
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_ATTN:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        const int ne11 = ggml_up(node->src1->ne[1], GGML_SOFT_MAX_UNROLL);

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_FF:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_NONE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_COUNT:
                    {
                        GGML_ASSERT(false);
                    } break;
            }
        }

        if (cgraph->work != NULL && work_size > cgraph->work_size) {
            GGML_ASSERT(false); // TODO: better handling
        }

        if (work_size > 0 && cgraph->work == NULL) {
            cgraph->work_size = work_size + CACHE_LINE_SIZE*(n_threads - 1);

            GGML_PRINT_DEBUG("%s: allocating work buffer for graph (%zu bytes)\n", __func__, cgraph->work_size);
            cgraph->work = ggml_new_tensor_1d(ctx, GGML_TYPE_I8, cgraph->work_size);
        }
    }

    const int64_t perf_start_cycles  = ggml_perf_cycles();
    const int64_t perf_start_time_us = ggml_perf_time_us();

    for (int i = 0; i < cgraph->n_nodes; i++) {
        GGML_PRINT_DEBUG_5("%s: %d/%d\n", __func__, i, cgraph->n_nodes);

        struct ggml_tensor * node = cgraph->nodes[i];

        // TODO: this could be used to avoid unnecessary computations, but it needs to be improved
        //if (node->grad == NULL && node->perf_runs > 0) {
        //    continue;
        //}

        const int64_t perf_node_start_cycles  = ggml_perf_cycles();
        const int64_t perf_node_start_time_us = ggml_perf_time_us();

        // INIT
        struct ggml_compute_params params = {
            /*.type  =*/ GGML_TASK_INIT,
            /*.ith   =*/ 0,
            /*.nth   =*/ node->n_tasks,
            /*.wsize =*/ cgraph->work ? ggml_nbytes(cgraph->work) : 0,
            /*.wdata =*/ cgraph->work ? cgraph->work->data : NULL,
        };

        ggml_compute_forward(&params, node);

        // COMPUTE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_COMPUTE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // FINALIZE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_FINALIZE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_FINALIZE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // performance stats (node)
        {
            int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_node_start_cycles;
            int64_t perf_time_us_cur = ggml_perf_time_us() - perf_node_start_time_us;

            node->perf_runs++;
            node->perf_cycles  += perf_cycles_cur;
            node->perf_time_us += perf_time_us_cur;
        }
    }

    // join thread pool
    if (n_threads > 1) {
        atomic_store(&state_shared.stop, true);
        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            int rc = ggml_thread_join(workers[j].thrd, NULL);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }

        ggml_lock_destroy(&state_shared.spin);
    }

    // performance stats (graph)
    {
        int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_start_cycles;
        int64_t perf_time_us_cur = ggml_perf_time_us() - perf_start_time_us;

        cgraph->perf_runs++;
        cgraph->perf_cycles  += perf_cycles_cur;
        cgraph->perf_time_us += perf_time_us_cur;

        GGML_PRINT_DEBUG("%s: perf (%d) - cpu = %.3f / %.3f ms, wall = %.3f / %.3f ms\n",
                __func__, cgraph->perf_runs,
                (double) perf_cycles_cur      / (double) ggml_cycles_per_ms(),
                (double) cgraph->perf_cycles  / (double) ggml_cycles_per_ms() / (double) cgraph->perf_runs,
                (double) perf_time_us_cur     / 1000.0,
                (double) cgraph->perf_time_us / 1000.0 / cgraph->perf_runs);
    }
}